

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_solve_dense.c
# Opt level: O1

lu_int basiclu_solve_dense(lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux
                          ,lu_int *Wi,double *Wx,double *rhs,double *lhs,char trans)

{
  lu_int lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  lu this;
  
  lVar1 = lu_load(&this,istore,xstore,Li,Lx,Ui,Ux,Wi,Wx);
  if (lVar1 == 0) {
    auVar6._0_4_ = -(uint)((int)rhs == 0);
    auVar6._4_4_ = -(uint)((int)((ulong)rhs >> 0x20) == 0);
    auVar6._8_4_ = -(uint)((int)lhs == 0);
    auVar6._12_4_ = -(uint)((int)((ulong)lhs >> 0x20) == 0);
    auVar9._4_4_ = auVar6._0_4_;
    auVar9._0_4_ = auVar6._4_4_;
    auVar9._8_4_ = auVar6._12_4_;
    auVar9._12_4_ = auVar6._8_4_;
    auVar8._0_4_ = -(uint)((int)Wi == 0);
    auVar8._4_4_ = -(uint)((int)((ulong)Wi >> 0x20) == 0);
    auVar8._8_4_ = -(uint)((int)Wx == 0);
    auVar8._12_4_ = -(uint)((int)((ulong)Wx >> 0x20) == 0);
    auVar7._4_4_ = auVar8._0_4_;
    auVar7._0_4_ = auVar8._4_4_;
    auVar7._8_4_ = auVar8._12_4_;
    auVar7._12_4_ = auVar8._8_4_;
    auVar8 = packssdw(auVar7 & auVar8,auVar9 & auVar6);
    auVar4._0_4_ = -(uint)((int)Ui == 0);
    auVar4._4_4_ = -(uint)((int)((ulong)Ui >> 0x20) == 0);
    auVar4._8_4_ = -(uint)((int)Ux == 0);
    auVar4._12_4_ = -(uint)((int)((ulong)Ux >> 0x20) == 0);
    auVar5._4_4_ = auVar4._0_4_;
    auVar5._0_4_ = auVar4._4_4_;
    auVar5._8_4_ = auVar4._12_4_;
    auVar5._12_4_ = auVar4._8_4_;
    auVar3._0_4_ = -(uint)((int)Li == 0);
    auVar3._4_4_ = -(uint)((int)((ulong)Li >> 0x20) == 0);
    auVar3._8_4_ = -(uint)((int)Lx == 0);
    auVar3._12_4_ = -(uint)((int)((ulong)Lx >> 0x20) == 0);
    auVar2._4_4_ = auVar3._0_4_;
    auVar2._0_4_ = auVar3._4_4_;
    auVar2._8_4_ = auVar3._12_4_;
    auVar2._12_4_ = auVar3._8_4_;
    auVar3 = packssdw(auVar2 & auVar3,auVar5 & auVar4);
    auVar3 = packssdw(auVar3,auVar8);
    lVar1 = -3;
    if ((((((((auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]) {
      if (this.nupdate < 0) {
        lVar1 = -2;
      }
      else {
        lu_solve_dense(&this,rhs,lhs,trans);
        lVar1 = 0;
      }
    }
    lVar1 = lu_save(&this,istore,xstore,lVar1);
  }
  return lVar1;
}

Assistant:

lu_int basiclu_solve_dense
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    const double rhs[],
    double lhs[],
    char trans
)
{
    struct lu this;
    lu_int status;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && rhs && lhs))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else
    {
        lu_solve_dense(&this, rhs, lhs, trans);
    }

    return lu_save(&this, istore, xstore, status);
}